

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall nigel::Lexer::printLexerStructure(Lexer *this,CodeBase *base)

{
  _List_node_base *p_Var1;
  double __x;
  double __x_00;
  double __x_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  shared_ptr<nigel::Token> l;
  string local_50;
  
  std::__cxx11::to_string
            (&local_50,
             (base->lexerStruct).
             super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
             ._M_impl._M_node._M_size);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,
                 "Lexer structure (",&local_50);
  std::operator+(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,
                 " items): ");
  helper::log((helper *)&local_90,__x);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string
            ((string *)&l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = (_List_node_base *)&base->lexerStruct;
  while (p_Var1 = (((_List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&base->lexerStruct) {
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
    (*(l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token[2])
              (&local_90,l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    helper::log((helper *)&local_90,__x_00);
    std::__cxx11::string::~string((string *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  __x_01 = (double)std::__cxx11::string::string((string *)&local_90,"Lexer end",(allocator *)&l);
  helper::log((helper *)&local_90,__x_01);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Lexer::printLexerStructure( CodeBase & base )
	{
		log( "Lexer structure (" + to_string( base.lexerStruct.size() ) + " items): " );
		for( auto l : base.lexerStruct )
		{
			log( l->toString( true ) );
		}
		log( "Lexer end" );
	}